

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

_lookup_path_token * __thiscall
c4::yml::Tree::_next_token
          (_lookup_path_token *__return_storage_ptr__,Tree *this,lookup_result *r,
          _lookup_path_token *parent)

{
  size_t more;
  pfn_error p_Var1;
  NodeType_e NVar2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  bool bVar7;
  size_t sVar8;
  _lookup_path_token *p_Var9;
  Tree *pTVar10;
  ro_substr chars;
  csubstr cVar11;
  csubstr unres;
  char msg [55];
  pfn_free p_Stack_a8;
  pfn_error local_a0;
  char *pcStack_80;
  size_t local_78;
  char *pcStack_58;
  size_t local_50;
  
  unres = lookup_result::unresolved(r);
  if (unres.str != (char *)0x0 && unres.len != 0) {
    if (*unres.str != '[') {
      pTVar10 = (Tree *)&unres;
      chars.len = 2;
      chars.str = ".[";
      sVar8 = basic_substring<const_char>::first_of((basic_substring<const_char> *)pTVar10,chars,0);
      if (sVar8 == 0xffffffffffffffff) {
        _advance(pTVar10,r,unres.len);
        NVar2 = (parent->type).type;
        (__return_storage_ptr__->value).str = unres.str;
        (__return_storage_ptr__->value).len = unres.len;
        if (NVar2 == NOTYPE || (NVar2 & SEQ) != NOTYPE) {
          (__return_storage_ptr__->type).type = VAL;
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->type).type = KEYVAL;
        return __return_storage_ptr__;
      }
      if (unres.len <= sVar8) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          p_Var9 = (_lookup_path_token *)(*pcVar3)();
          return p_Var9;
        }
        handle_error(0x1e6196,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      if ((unres.str[sVar8] != '.') && (unres.str[sVar8] != '[')) {
        builtin_strncpy(msg,"check failed: (unres[pos] == \'.\' || unres[pos] == \'[\')",0x37);
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          p_Var9 = (_lookup_path_token *)(*pcVar3)();
          return p_Var9;
        }
        p_Var1 = (this->m_callbacks).m_error;
        cVar11 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_50 = cVar11.len;
        pcStack_58 = cVar11.str;
        pTVar10 = (Tree *)msg;
        LVar4.super_LineCol.col = 0;
        LVar4.super_LineCol.offset = SUB168(ZEXT816(0x69c9) << 0x40,0);
        LVar4.super_LineCol.line = SUB168(ZEXT816(0x69c9) << 0x40,8);
        LVar4.name.str = pcStack_58;
        LVar4.name.len = local_50;
        (*p_Var1)((char *)pTVar10,0x37,LVar4,(this->m_callbacks).m_user_data);
      }
      if (unres.len <= sVar8) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          p_Var9 = (_lookup_path_token *)(*pcVar3)();
          return p_Var9;
        }
        handle_error(0x1e6196,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      if (unres.str[sVar8] != '[') {
        if (unres.str[sVar8] == '.') {
          if (sVar8 == 0) {
            builtin_strncpy(msg,"check failed: (pos != 0)",0x19);
            if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
              pcVar3 = (code *)swi(3);
              p_Var9 = (_lookup_path_token *)(*pcVar3)();
              return p_Var9;
            }
            p_Var1 = (this->m_callbacks).m_error;
            cVar11 = to_csubstr(
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               );
            local_78 = cVar11.len;
            pcStack_80 = cVar11.str;
            pTVar10 = (Tree *)msg;
            LVar5.super_LineCol.col = 0;
            LVar5.super_LineCol.offset = SUB168(ZEXT816(0x69cc) << 0x40,0);
            LVar5.super_LineCol.line = SUB168(ZEXT816(0x69cc) << 0x40,8);
            LVar5.name.str = pcStack_80;
            LVar5.name.len = local_78;
            (*p_Var1)((char *)pTVar10,0x19,LVar5,(this->m_callbacks).m_user_data);
          }
          _advance(pTVar10,r,sVar8 + 1);
          if (sVar8 <= unres.len) {
            basic_substring<const_char>::basic_substring
                      ((basic_substring<const_char> *)msg,unres.str,sVar8);
            (__return_storage_ptr__->value).str = (char *)msg._0_8_;
            (__return_storage_ptr__->value).len = CONCAT71(msg._9_7_,msg[8]);
            (__return_storage_ptr__->type).type = MAP;
            return __return_storage_ptr__;
          }
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar3 = (code *)swi(3);
            p_Var9 = (_lookup_path_token *)(*pcVar3)();
            return p_Var9;
          }
          handle_error(0x1e6196,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x154e,"num <= len || num == npos");
        }
        builtin_strncpy(msg,"check failed: (unres[pos] == \'[\'",0x20);
        msg[0x20] = ')';
        msg[0x21] = '\0';
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          p_Var9 = (_lookup_path_token *)(*pcVar3)();
          return p_Var9;
        }
        p_Var1 = (this->m_callbacks).m_error;
        cVar11 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_a0 = (pfn_error)cVar11.len;
        p_Stack_a8 = (pfn_free)cVar11.str;
        pTVar10 = (Tree *)msg;
        LVar6.super_LineCol.col = 0;
        LVar6.super_LineCol.offset = SUB168(ZEXT816(0x69d1) << 0x40,0);
        LVar6.super_LineCol.line = SUB168(ZEXT816(0x69d1) << 0x40,8);
        LVar6.name.str = (char *)p_Stack_a8;
        LVar6.name.len = (size_t)local_a0;
        (*p_Var1)((char *)pTVar10,0x22,LVar6,(this->m_callbacks).m_user_data);
      }
      _advance(pTVar10,r,sVar8);
      if (sVar8 <= unres.len) {
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)msg,unres.str,sVar8);
        (__return_storage_ptr__->value).str = (char *)msg._0_8_;
        (__return_storage_ptr__->value).len = CONCAT71(msg._9_7_,msg[8]);
        (__return_storage_ptr__->type).type = SEQ;
        return __return_storage_ptr__;
      }
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        p_Var9 = (_lookup_path_token *)(*pcVar3)();
        return p_Var9;
      }
      handle_error(0x1e6196,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x154e,"num <= len || num == npos");
    }
    sVar8 = basic_substring<const_char>::first_of(&unres,']',0);
    if (sVar8 != 0xffffffffffffffff) {
      more = sVar8 + 1;
      if (more == 0xffffffffffffffff || sVar8 < unres.len) {
        sVar8 = unres.len;
        if (more != 0xffffffffffffffff) {
          sVar8 = more;
        }
        pTVar10 = (Tree *)msg;
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)pTVar10,unres.str,sVar8);
        _advance(pTVar10,r,more);
        (__return_storage_ptr__->value).str = (char *)msg._0_8_;
        (__return_storage_ptr__->value).len = CONCAT71(msg._9_7_,msg[8]);
        (__return_storage_ptr__->type).type = KEY;
        return __return_storage_ptr__;
      }
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        p_Var9 = (_lookup_path_token *)(*pcVar3)();
        return p_Var9;
      }
      handle_error(0x1e6196,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x154e,"num <= len || num == npos");
    }
  }
  (__return_storage_ptr__->value).str = (char *)0x0;
  (__return_storage_ptr__->value).len = 0;
  (__return_storage_ptr__->type).type = NOTYPE;
  return __return_storage_ptr__;
}

Assistant:

Tree::_lookup_path_token Tree::_next_token(lookup_result *r, _lookup_path_token const& parent) const
{
    csubstr unres = r->unresolved();
    if(unres.empty())
        return {};

    // is it an indexation like [0], [1], etc?
    if(unres.begins_with('['))
    {
        size_t pos = unres.find(']');
        if(pos == csubstr::npos)
            return {};
        csubstr idx = unres.first(pos + 1);
        _advance(r, pos + 1);
        return {idx, KEY};
    }

    // no. so it must be a name
    size_t pos = unres.first_of(".[");
    if(pos == csubstr::npos)
    {
        _advance(r, unres.len);
        NodeType t;
        if(( ! parent) || parent.type.is_seq())
            return {unres, VAL};
        return {unres, KEYVAL};
    }

    // it's either a map or a seq
    _RYML_CB_ASSERT(m_callbacks, unres[pos] == '.' || unres[pos] == '[');
    if(unres[pos] == '.')
    {
        _RYML_CB_ASSERT(m_callbacks, pos != 0);
        _advance(r, pos + 1);
        return {unres.first(pos), MAP};
    }

    _RYML_CB_ASSERT(m_callbacks, unres[pos] == '[');
    _advance(r, pos);
    return {unres.first(pos), SEQ};
}